

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__hdr_to_ldr(float *data,int x,int y,int comp)

{
  uint uVar1;
  stbi_uc *psVar2;
  long lVar3;
  uint uVar4;
  stbi_uc *psVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  float *pfVar9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  
  uVar4 = x * y;
  psVar2 = (stbi_uc *)malloc((long)(int)(uVar4 * comp));
  if (psVar2 == (stbi_uc *)0x0) {
    free(data);
    stbi__g_failure_reason = "outofmem";
  }
  else {
    if (0 < (int)uVar4) {
      uVar7 = (comp + (comp & 1U)) - 1;
      lVar6 = (long)comp;
      uVar10 = 0;
      psVar5 = psVar2;
      pfVar9 = data;
      do {
        uVar1 = 0;
        if (0 < (int)uVar7) {
          uVar8 = 0;
          do {
            fVar11 = powf(pfVar9[uVar8] * stbi__h2l_scale_i,stbi__h2l_gamma_i);
            fVar12 = fVar11 * 255.0 + 0.5;
            fVar11 = 0.0;
            if (0.0 <= fVar12) {
              fVar11 = fVar12;
            }
            fVar12 = 255.0;
            if (fVar11 <= 255.0) {
              fVar12 = fVar11;
            }
            psVar5[uVar8] = (stbi_uc)(int)fVar12;
            uVar8 = uVar8 + 1;
            uVar1 = uVar7;
          } while (uVar7 != uVar8);
        }
        if ((int)uVar1 < comp) {
          lVar3 = (ulong)uVar1 + uVar10 * lVar6;
          fVar12 = data[lVar3] * 255.0 + 0.5;
          fVar11 = 0.0;
          if (0.0 <= fVar12) {
            fVar11 = fVar12;
          }
          fVar12 = 255.0;
          if (fVar11 <= 255.0) {
            fVar12 = fVar11;
          }
          psVar2[lVar3] = (stbi_uc)(int)fVar12;
        }
        uVar10 = uVar10 + 1;
        pfVar9 = pfVar9 + lVar6;
        psVar5 = psVar5 + lVar6;
      } while (uVar10 != uVar4);
    }
    free(data);
  }
  return psVar2;
}

Assistant:

static stbi_uc *stbi__hdr_to_ldr(float   *data, int x, int y, int comp)
{
   int i,k,n;
   stbi_uc *output = (stbi_uc *) stbi__malloc(x * y * comp);
   if (output == NULL) { STBI_FREE(data); return stbi__errpuc("outofmem", "Out of memory"); }
   // compute number of non-alpha components
   if (comp & 1) n = comp; else n = comp-1;
   for (i=0; i < x*y; ++i) {
      for (k=0; k < n; ++k) {
         float z = (float) pow(data[i*comp+k]*stbi__h2l_scale_i, stbi__h2l_gamma_i) * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
      if (k < comp) {
         float z = data[i*comp+k] * 255 + 0.5f;
         if (z < 0) z = 0;
         if (z > 255) z = 255;
         output[i*comp + k] = (stbi_uc) stbi__float2int(z);
      }
   }
   STBI_FREE(data);
   return output;
}